

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O2

void mh_assoc_del_resize(mh_assoc_t *h,mh_int_t x,void *arg)

{
  uint uVar1;
  assoc_val **ppaVar2;
  mh_assoc_t *h_00;
  assoc_val *paVar3;
  mh_int_t *pmVar4;
  ulong uVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  sbyte sVar9;
  uint uVar10;
  void *extraout_RDX;
  uint uVar11;
  assoc_val **ppaVar12;
  assoc_val **rval;
  void *arg_00;
  
  ppaVar2 = h->p;
  h_00 = h->shadow;
  paVar3 = ppaVar2[x];
  uVar6 = PMurHash32(0xd,(paVar3->key).id,(paVar3->key).id_len);
  uVar1 = h_00->n_buckets;
  ppaVar12 = (assoc_val **)((ulong)uVar6 % (ulong)uVar1);
  rval = (assoc_val **)(ulong)(uVar1 - 1);
  uVar10 = uVar6 % (uVar1 - 1) + 1;
  arg_00 = (void *)(ulong)uVar10;
  pmVar4 = h_00->b;
  do {
    uVar11 = (uint)ppaVar12;
    uVar5 = (ulong)ppaVar12 >> 4;
    uVar8 = pmVar4[uVar5];
    sVar9 = (sbyte)(uVar11 & 0xf);
    if ((uVar8 >> (uVar11 & 0xf) & 1) != 0) {
      rval = h_00->p + (long)ppaVar12;
      iVar7 = mh_cmp_eq(ppaVar2 + x,rval,arg_00);
      arg_00 = extraout_RDX;
      if (iVar7 != 0) {
        if (uVar1 != uVar11) {
          pmVar4[uVar5] = uVar8 & ~(1 << sVar9);
          h_00->size = h_00->size - 1;
          if (((pmVar4[uVar5] >> sVar9) >> 0x10 & 1) == 0) {
            h_00->n_dirty = h_00->n_dirty - 1;
          }
          if (h_00->resize_position != 0) {
            mh_assoc_del_resize(h_00,uVar11,arg);
            rval = ppaVar12;
          }
        }
LAB_00111c86:
        mh_assoc_resize(h,rval);
        return;
      }
    }
    if (((uVar8 >> sVar9) >> 0x10 & 1) == 0) goto LAB_00111c86;
    uVar11 = uVar11 + uVar10;
    uVar8 = uVar1;
    if (uVar11 < uVar1) {
      uVar8 = 0;
    }
    ppaVar12 = (assoc_val **)(ulong)(uVar11 - uVar8);
  } while( true );
}

Assistant:

void __attribute__((noinline))
_mh(del_resize)(struct _mh(t) *h, mh_int_t x,
		mh_arg_t arg)
{
	struct _mh(t) *s = h->shadow;
	uint32_t y = _mh(get)(s, (const mh_node_t *) &(h->p[x]),
			      arg);
	_mh(del)(s, y, arg);
	_mh(resize)(h, arg);
}